

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

bool __thiscall State::isSolvable(State *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int **ppiVar4;
  bool bVar5;
  ulong uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  undefined1 *puVar11;
  long lVar12;
  int j;
  ulong uVar13;
  long lStack_30;
  
  uVar1 = this->size;
  lVar10 = -((ulong)uVar1 * 4 + 0xf & 0xfffffffffffffff0);
  puVar7 = &stack0xffffffffffffffd8 + lVar10;
  uVar2 = this->height;
  uVar3 = this->width;
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar3) {
    uVar8 = (ulong)uVar3;
  }
  uVar9 = 0;
  if (0 < (int)uVar2) {
    uVar9 = (ulong)uVar2;
  }
  ppiVar4 = this->tiles;
  puVar11 = puVar7;
  for (; uVar6 != uVar9; uVar6 = uVar6 + 1) {
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      *(int *)(puVar11 + uVar13 * 4) = ppiVar4[uVar6][uVar13];
    }
    puVar11 = puVar11 + (long)(int)uVar2 * 4;
  }
  uVar6 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  *(undefined8 *)((long)&lStack_30 + lVar10) = 1;
  lVar10 = *(long *)((long)&lStack_30 + lVar10);
  bVar5 = false;
  for (; uVar6 != uVar8; uVar6 = uVar6 + 1) {
    lVar12 = lVar10;
    if (*(int *)(puVar7 + uVar6 * 4) != 0) {
      for (; (int)lVar12 < (int)uVar1; lVar12 = lVar12 + 1) {
        bVar5 = (bool)(bVar5 ^ (*(int *)(puVar7 + lVar12 * 4) < *(int *)(puVar7 + uVar6 * 4) &&
                               *(int *)(puVar7 + lVar12 * 4) != 0));
      }
    }
    lVar10 = lVar10 + 1;
  }
  if (uVar3 == 0) {
    bVar5 = (bool)(bVar5 ^ (uVar2 - (this->blank).height & 0x80000001) == 1);
  }
  else {
    bVar5 = !bVar5;
  }
  return bVar5;
}

Assistant:

bool State::isSolvable() {
    int swaps = 0;
    int flatTiles[size];

    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            flatTiles[height * i + j] = tiles[i][j];
        }
    }

    for (int i = 0; i < size; i++) {
        int tile = flatTiles[i];
        if (tile == 0) continue;

        for (int j = i + 1; j < size; j++) {
            int nextTile = flatTiles[j];
            if (nextTile == 0) continue;

            if (tile > nextTile) {
                swaps++;
            }
        }
    }

    bool evenSwaps = swaps % 2 == 0;
    bool blankOddRow = (height - blank.height) % 2 == 1;

    // Giving credit where credit is due.
    // http://www.cs.bham.ac.uk/~mdr/teaching/modules04/java2/TilesSolvability.html
    return width == 0 ? blankOddRow == evenSwaps : evenSwaps;
}